

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::ReadCacheFile(cmDependsC *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *f2;
  mapped_type *ppcVar5;
  long lVar6;
  undefined1 local_2a8 [8];
  UnscannedEntry entry;
  bool res;
  cmFileTimeComparison comp;
  int newer;
  bool haveFileName;
  cmIncludeLines *cacheEntry;
  string line;
  long local_218;
  ifstream fin;
  cmDependsC *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_218,pcVar4,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&cacheEntry);
      _newer = (cmIncludeLines *)0x0;
      comp.Internals._7_1_ = 0;
      do {
        while( true ) {
          while( true ) {
            bVar2 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)&local_218,(string *)&cacheEntry,(bool *)0x0,-1);
            if (!bVar2) {
              line.field_2._8_4_ = 0;
              goto LAB_008444a3;
            }
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) break;
            _newer = (cmIncludeLines *)0x0;
            comp.Internals._7_1_ = 0;
          }
          if ((comp.Internals._7_1_ & 1) == 0) break;
          if (_newer != (cmIncludeLines *)0x0) {
            UnscannedEntry::UnscannedEntry((UnscannedEntry *)local_2a8);
            std::__cxx11::string::operator=((string *)local_2a8,(string *)&cacheEntry);
            bVar2 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)&local_218,(string *)&cacheEntry,(bool *)0x0,-1);
            if (bVar2) {
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheEntry,"-");
              if (bVar2) {
                std::__cxx11::string::operator=
                          ((string *)(entry.FileName.field_2._M_local_buf + 8),(string *)&cacheEntry
                          );
              }
              std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
              push_back(&_newer->UnscannedEntries,(value_type *)local_2a8);
            }
            UnscannedEntry::~UnscannedEntry((UnscannedEntry *)local_2a8);
          }
        }
        comp.Internals._7_1_ = 1;
        comp.Internals._0_4_ = 0;
        cmFileTimeComparison::cmFileTimeComparison((cmFileTimeComparison *)&stack0xfffffffffffffda0)
        ;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        f2 = (char *)std::__cxx11::string::c_str();
        entry.QuotedLocation.field_2._M_local_buf[0xf] =
             cmFileTimeComparison::FileTimeCompare
                       ((cmFileTimeComparison *)&stack0xfffffffffffffda0,pcVar4,f2,(int *)&comp);
        if (((bool)entry.QuotedLocation.field_2._M_local_buf[0xf]) && ((int)comp.Internals == 1)) {
          _newer = (cmIncludeLines *)operator_new(0x20);
          cmIncludeLines::cmIncludeLines(_newer);
          ppcVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                    ::operator[](&this->FileCache,(key_type *)&cacheEntry);
          *ppcVar5 = _newer;
LAB_0084436d:
          line.field_2._8_4_ = 0;
        }
        else {
          if ((bool)entry.QuotedLocation.field_2._M_local_buf[0xf]) goto LAB_0084436d;
          lVar6 = std::__cxx11::string::find((char *)&cacheEntry,0xa540db);
          if (lVar6 == 0) {
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&cacheEntry,&this->IncludeRegexLineString);
            if (!bVar2) goto LAB_0084436d;
            line.field_2._8_4_ = 1;
          }
          else {
            lVar6 = std::__cxx11::string::find((char *)&cacheEntry,0xa5408e);
            if (lVar6 == 0) {
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&cacheEntry,&this->IncludeRegexScanString);
              if (!bVar2) goto LAB_0084436d;
              line.field_2._8_4_ = 1;
            }
            else {
              lVar6 = std::__cxx11::string::find((char *)&cacheEntry,0xa540a2);
              if (lVar6 == 0) {
                bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&cacheEntry,&this->IncludeRegexComplainString);
                if (!bVar2) goto LAB_0084436d;
                line.field_2._8_4_ = 1;
              }
              else {
                lVar6 = std::__cxx11::string::find((char *)&cacheEntry,0xa540ef);
                if ((lVar6 != 0) ||
                   (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&cacheEntry,&this->IncludeRegexTransformString),
                   !bVar2)) goto LAB_0084436d;
                line.field_2._8_4_ = 1;
              }
            }
          }
        }
        cmFileTimeComparison::~cmFileTimeComparison
                  ((cmFileTimeComparison *)&stack0xfffffffffffffda0);
      } while (line.field_2._8_4_ == 0);
LAB_008444a3:
      std::__cxx11::string::~string((string *)&cacheEntry);
    }
    else {
      line.field_2._8_4_ = 1;
    }
    std::ifstream::~ifstream(&local_218);
  }
  return;
}

Assistant:

void cmDependsC::ReadCacheFile()
{
  if (this->CacheFileName.empty()) {
    return;
  }
  cmsys::ifstream fin(this->CacheFileName.c_str());
  if (!fin) {
    return;
  }

  std::string line;
  cmIncludeLines* cacheEntry = CM_NULLPTR;
  bool haveFileName = false;

  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty()) {
      cacheEntry = CM_NULLPTR;
      haveFileName = false;
      continue;
    }
    // the first line after an empty line is the name of the parsed file
    if (!haveFileName) {
      haveFileName = true;
      int newer = 0;
      cmFileTimeComparison comp;
      bool res = comp.FileTimeCompare(this->CacheFileName.c_str(),
                                      line.c_str(), &newer);

      if (res && newer == 1) // cache is newer than the parsed file
      {
        cacheEntry = new cmIncludeLines;
        this->FileCache[line] = cacheEntry;
      }
      // file doesn't exist, check that the regular expressions
      // haven't changed
      else if (!res) {
        if (line.find(INCLUDE_REGEX_LINE_MARKER) == 0) {
          if (line != this->IncludeRegexLineString) {
            return;
          }
        } else if (line.find(INCLUDE_REGEX_SCAN_MARKER) == 0) {
          if (line != this->IncludeRegexScanString) {
            return;
          }
        } else if (line.find(INCLUDE_REGEX_COMPLAIN_MARKER) == 0) {
          if (line != this->IncludeRegexComplainString) {
            return;
          }
        } else if (line.find(INCLUDE_REGEX_TRANSFORM_MARKER) == 0) {
          if (line != this->IncludeRegexTransformString) {
            return;
          }
        }
      }
    } else if (cacheEntry != CM_NULLPTR) {
      UnscannedEntry entry;
      entry.FileName = line;
      if (cmSystemTools::GetLineFromStream(fin, line)) {
        if (line != "-") {
          entry.QuotedLocation = line;
        }
        cacheEntry->UnscannedEntries.push_back(entry);
      }
    }
  }
}